

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

StringSet * __thiscall
OSTEI_VRR_Algorithm_Base::GenerateVarReq_abi_cxx11_
          (StringSet *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,RRStepType rrstep)

{
  _Rb_tree_header *p_Var1;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&local_38,"one_over_2pq",&local_39);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (rrstep < K) {
    std::__cxx11::string::string((string *)&local_38,"a_over_p",&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"aop_PQ",&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"one_over_2p",&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_38);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"a_over_q",&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"aoq_PQ",&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"one_over_2q",&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  switch(rrstep) {
  case I:
    std::__cxx11::string::string((string *)&local_38,"P_PA",&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_38);
    break;
  case J:
    std::__cxx11::string::string((string *)&local_38,"P_PB",&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_38);
    break;
  case K:
    std::__cxx11::string::string((string *)&local_38,"Q_PA",&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_38);
    break;
  case L:
    std::__cxx11::string::string((string *)&local_38,"Q_PB",&local_39);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_38);
    break;
  default:
    goto switchD_0010e9f6_default;
  }
  std::__cxx11::string::~string((string *)&local_38);
switchD_0010e9f6_default:
  return __return_storage_ptr__;
}

Assistant:

StringSet OSTEI_VRR_Algorithm_Base::GenerateVarReq(RRStepType rrstep) const
{
    StringSet req;

    req.insert("one_over_2pq");

    if(rrstep == RRStepType::I || rrstep == RRStepType::J)
    {
        req.insert("a_over_p");
        req.insert("aop_PQ");
        req.insert("one_over_2p");
    }
    else
    {
        req.insert("a_over_q");
        req.insert("aoq_PQ");
        req.insert("one_over_2q");
    }

    switch(rrstep)
    {
        case RRStepType::I:
            req.insert("P_PA");
            break;
        case RRStepType::J:
            req.insert("P_PB");
            break;
        case RRStepType::K:
            req.insert("Q_PA");
            break;
        case RRStepType::L:
            req.insert("Q_PB");
            break;
    }

    return req;
}